

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

State __thiscall QAccessibleComboBox::state(QAccessibleComboBox *this)

{
  char cVar1;
  bool bVar2;
  State SVar3;
  QComboBox *this_00;
  QAbstractItemView *pQVar4;
  State SVar5;
  ulong uVar6;
  
  SVar3 = QAccessibleWidget::state(&this->super_QAccessibleWidget);
  uVar6 = (ulong)SVar3 >> 0x20;
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  SVar5 = SVar3;
  if (this_00 == (QComboBox *)0x0) goto LAB_00515af6;
  cVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x10))(this);
  if (cVar1 == '\0') {
LAB_00515acf:
    uVar6 = 0;
  }
  else {
    pQVar4 = QComboBox::view(this_00);
    if (pQVar4 == (QAbstractItemView *)0x0) goto LAB_00515acf;
    pQVar4 = QComboBox::view(this_00);
    uVar6 = (ulong)(((pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                    widget_attributes >> 4 & 0x800);
  }
  SVar5 = (State)(SVar3._0_4_ & 0xffffb7ff | uVar6 | 0x4000);
  bVar2 = QComboBox::isEditable(this_00);
  uVar6 = (ulong)(SVar3._4_4_ & 0xfe) | (ulong)bVar2;
LAB_00515af6:
  return (State)((ulong)SVar5 & 0xffffffff | (uVar6 & 0xff) << 0x20 | 0xaaaaaa0000000000);
}

Assistant:

QAccessible::State QAccessibleComboBox::state() const
{
    QAccessible::State s = QAccessibleWidget::state();

    if (QComboBox *cBox = comboBox()) {
        s.expandable = true;
        s.expanded = isValid() && cBox->view() && cBox->view()->isVisible();
        s.editable = cBox->isEditable();
    }
    return s;
}